

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCaseResult.hpp
# Opt level: O3

ostream * xe::ri::operator<<(ostream *str,NumericValue *value)

{
  ostream *poVar1;
  
  if (value->m_type == TYPE_INT64) {
    poVar1 = std::ostream::_M_insert<long>((long)str);
    return poVar1;
  }
  if (value->m_type == TYPE_FLOAT64) {
    *(undefined8 *)(str + *(long *)(*(long *)str + -0x18) + 8) = 0x11;
    poVar1 = std::ostream::_M_insert<double>((value->m_value).float64);
    return poVar1;
  }
  return str;
}

Assistant:

double			getFloat64		(void) const	{ DE_ASSERT(getType() == TYPE_FLOAT64);	return m_value.float64;	}